

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandPdr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pDriver;
  char *pcVar4;
  char *pcVar5;
  Abc_Ntk_t *pNtk_00;
  Pdr_Par_t Pars;
  char *local_108;
  Pdr_Par_t local_f8;
  Abc_Ntk_t *local_38;
  
  local_38 = Abc_FrameReadNtk(pAbc);
  Pdr_ManSetDefaultParams(&local_f8);
  local_108 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_00273eae:
  iVar1 = Extra_UtilGetopt(argc,argv,"MFCDQTHGSLIaxrmuyfqipdegjonctkvwzh");
  pNtk_00 = local_38;
  iVar3 = globalUtilOptind;
  switch(iVar1) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
      break;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_f8.nConfLimit = uVar2;
LAB_002740d5:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
switchD_00273ece_caseD_45:
      Abc_Print(-2,"usage: pdr [-MFCDQTHGS <num>] [-LI <file>] [-axrmuyfqipdegjonctkvwzh]\n");
      Abc_Print(-2,"\t         model checking using property directed reachability (aka IC3)\n");
      Abc_Print(-2,
                "\t         pioneered by Aaron R. Bradley (http://theory.stanford.edu/~arbrad/)\n");
      Abc_Print(-2,"\t         with improvements by Niklas Een (http://een.se/niklas/)\n");
      Abc_Print(-2,
                "\t-M num : limit on unused vars to trigger SAT solver recycling [default = %d]\n",
                (ulong)(uint)local_f8.nRecycle);
      Abc_Print(-2,"\t-F num : limit on timeframes explored to stop computation [default = %d]\n",
                (ulong)(uint)local_f8.nFrameMax);
      Abc_Print(-2,"\t-C num : limit on conflicts in one SAT call (0 = no limit) [default = %d]\n",
                (ulong)(uint)local_f8.nConfLimit);
      Abc_Print(-2,
                "\t-D num : limit on conflicts during ind-generalization (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)local_f8.nConfGenLimit);
      Abc_Print(-2,
                "\t-Q num : limit on proof obligations before a restart (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)local_f8.nRestLimit);
      Abc_Print(-2,"\t-T num : runtime limit, in seconds (0 = no limit) [default = %d]\n",
                (ulong)(uint)local_f8.nTimeOut);
      Abc_Print(-2,
                "\t-H num : runtime limit per output, in miliseconds (with \"-a\") [default = %d]\n"
                ,(ulong)(uint)local_f8.nTimeOutOne);
      Abc_Print(-2,"\t-G num : runtime gap since the last CEX (0 = no limit) [default = %d]\n",
                (ulong)(uint)local_f8.nTimeOutGap);
      Abc_Print(-2,"\t-S num : * value to seed the SAT solver with [default = %d]\n",
                (ulong)(uint)local_f8.nRandomSeed);
      pcVar5 = "no logging";
      if (local_108 != (char *)0x0) {
        pcVar5 = local_108;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",pcVar5);
      pcVar5 = "default name";
      if (local_f8.pInvFileName != (char *)0x0) {
        pcVar5 = local_f8.pInvFileName;
      }
      Abc_Print(-2,"\t-I file: the invariant file name [default = %s]\n",pcVar5);
      pcVar4 = "yes";
      pcVar5 = "yes";
      if (local_f8.fSolveAll == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-a     : toggle solving all outputs even if one of them is SAT [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_f8.fStoreCex == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle storing CEXes when solving all outputs [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_f8.fTwoRounds == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle using more effort in generalization [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_f8.fMonoCnf == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle using monolythic CNF computation [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_f8.fNewXSim == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-u     : toggle updated X-valued simulation [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_f8.fFlopPrio == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-y     : toggle using structural flop priorities [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_f8.fFlopOrder == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle ordering flops by cost before generalization [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (local_f8.fShortest == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-q     : toggle creating only shortest counter-examples [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_f8.fShiftStart == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-i     : toggle clause pushing from an intermediate timeframe [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_f8.fReuseProofOblig == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-p     : toggle reusing proof-obligations in the last timeframe [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (local_f8.fDumpInv == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-d     : toggle dumping invariant (valid if init state is all-0) [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (local_f8.fUseSupp == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-e     : toggle using only support variables in the invariant [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_f8.fSkipGeneral == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-g     : toggle skipping expensive generalization step [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_f8.fSimpleGeneral == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-j     : toggle using simplified generalization step [default = %s]\n",pcVar5)
      ;
      pcVar5 = "yes";
      if (local_f8.fUsePropOut == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-o     : toggle using property output as inductive hypothesis [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_f8.fSkipDown == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-n     : * toggle skipping \'down\' in generalization [default = %s]\n",pcVar5
               );
      pcVar5 = "yes";
      if (local_f8.fCtgs == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-c     : * toggle handling CTGs in \'down\' [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_f8.fUseAbs == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using abstraction [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_f8.fUseSimpleRef == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-k     : toggle using simplified refinement [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_f8.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing optimization summary [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_f8.fVeryVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing detailed stats default = %s]\n",pcVar5);
      if (local_f8.fNotVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-z     : toggle suppressing report about solved outputs [default = %s]\n",
                pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n\n");
      Abc_Print(-2,"\t* Implementation of switches -S, -n, and -c is contributed by Zyad Hassan.\n")
      ;
      Abc_Print(-2,
                "\t  The theory and experiments supporting this work can be found in the following paper:\n"
               );
      Abc_Print(-2,
                "\t  Zyad Hassan, Aaron R. Bradley, Fabio Somenzi, \"Better Generalization in IC3\", FMCAD 2013.\n"
               );
      Abc_Print(-2,
                "\t  (http://www.cs.utexas.edu/users/hunt/FMCAD/FMCAD13/papers/85-Better-Generalization-IC3.pdf)\n"
               );
      return 1;
    }
    goto LAB_00273eae;
  case 0x44:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_f8.nConfGenLimit = uVar2;
      goto LAB_002740d5;
    }
    pcVar5 = "Command line switch \"-D\" should be followed by an integer.\n";
    break;
  case 0x45:
  case 0x4a:
  case 0x4b:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x52:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x68:
  case 0x6c:
  case 0x73:
    goto switchD_00273ece_caseD_45;
  case 0x46:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_f8.nFrameMax = uVar2;
      goto LAB_002740d5;
    }
    pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_f8.nTimeOutGap = uVar2;
      goto LAB_002740d5;
    }
    pcVar5 = "Command line switch \"-G\" should be followed by an integer.\n";
    break;
  case 0x48:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_f8.nTimeOutOne = uVar2;
      goto LAB_002740d5;
    }
    pcVar5 = "Command line switch \"-H\" should be followed by an integer.\n";
    break;
  case 0x49:
    if (globalUtilOptind < argc) {
      local_f8.pInvFileName = argv[globalUtilOptind];
LAB_00274099:
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00273eae;
    }
    pcVar5 = "Command line switch \"-I\" should be followed by a file name.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_108 = argv[globalUtilOptind];
      goto LAB_00274099;
    }
    pcVar5 = "Command line switch \"-L\" should be followed by a file name.\n";
    break;
  case 0x4d:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_f8.nRecycle = uVar2;
      goto LAB_002740d5;
    }
    pcVar5 = "Command line switch \"-M\" should be followed by an integer.\n";
    break;
  case 0x51:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_f8.nRestLimit = uVar2;
      goto LAB_002740d5;
    }
    pcVar5 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_f8.nRandomSeed = uVar2;
      goto LAB_002740d5;
    }
    pcVar5 = "Command line switch \"-S\" should be followed by an integer.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_f8.nTimeOut = uVar2;
      goto LAB_002740d5;
    }
    pcVar5 = "Command line switch \"-T\" should be followed by an integer.\n";
    break;
  case 0x61:
    local_f8.fSolveAll = local_f8.fSolveAll ^ 1;
    goto LAB_00273eae;
  case 99:
    local_f8.fCtgs = local_f8.fCtgs ^ 1;
    goto LAB_00273eae;
  case 100:
    local_f8.fDumpInv = local_f8.fDumpInv ^ 1;
    goto LAB_00273eae;
  case 0x65:
    local_f8.fUseSupp = local_f8.fUseSupp ^ 1;
    goto LAB_00273eae;
  case 0x66:
    local_f8.fFlopOrder = local_f8.fFlopOrder ^ 1;
    goto LAB_00273eae;
  case 0x67:
    local_f8.fSkipGeneral = local_f8.fSkipGeneral ^ 1;
    goto LAB_00273eae;
  case 0x69:
    local_f8.fShiftStart = local_f8.fShiftStart ^ 1;
    goto LAB_00273eae;
  case 0x6a:
    local_f8.fSimpleGeneral = local_f8.fSimpleGeneral ^ 1;
    goto LAB_00273eae;
  case 0x6b:
    local_f8.fUseSimpleRef = local_f8.fUseSimpleRef ^ 1;
    goto LAB_00273eae;
  case 0x6d:
    local_f8.fMonoCnf = local_f8.fMonoCnf ^ 1;
    goto LAB_00273eae;
  case 0x6e:
    local_f8.fSkipDown = local_f8.fSkipDown ^ 1;
    goto LAB_00273eae;
  case 0x6f:
    local_f8.fUsePropOut = local_f8.fUsePropOut ^ 1;
    goto LAB_00273eae;
  case 0x70:
    local_f8.fReuseProofOblig = local_f8.fReuseProofOblig ^ 1;
    goto LAB_00273eae;
  case 0x71:
    local_f8.fShortest = local_f8.fShortest ^ 1;
    goto LAB_00273eae;
  case 0x72:
    local_f8.fTwoRounds = local_f8.fTwoRounds ^ 1;
    goto LAB_00273eae;
  case 0x74:
    local_f8.fUseAbs = local_f8.fUseAbs ^ 1;
    goto LAB_00273eae;
  case 0x75:
    local_f8.fNewXSim = local_f8.fNewXSim ^ 1;
    goto LAB_00273eae;
  case 0x76:
    local_f8.fVerbose = local_f8.fVerbose ^ 1;
    goto LAB_00273eae;
  case 0x77:
    local_f8.fVeryVerbose = local_f8.fVeryVerbose ^ 1;
    goto LAB_00273eae;
  case 0x78:
    local_f8.fStoreCex = local_f8.fStoreCex ^ 1;
    goto LAB_00273eae;
  case 0x79:
    local_f8.fFlopPrio = local_f8.fFlopPrio ^ 1;
    goto LAB_00273eae;
  case 0x7a:
    local_f8.fNotVerbose = local_f8.fNotVerbose ^ 1;
    goto LAB_00273eae;
  default:
    if (iVar1 == -1) {
      if (local_38 == (Abc_Ntk_t *)0x0) {
        pcVar5 = "There is no current network.\n";
      }
      else {
        if (local_38->ntkType == ABC_NTK_STRASH) {
          if ((pAbc->fBatchMode == 0) || (1 < (uint)pAbc->Status)) {
            if (local_38->nObjCounts[8] == 0) {
              pNtk = Abc_NtkDup(local_38);
              pDriver = Abc_AigConst1(pNtk);
              Abc_NtkAddLatch(pNtk,pDriver,ABC_INIT_ONE);
            }
            else {
              pNtk = (Abc_Ntk_t *)0x0;
            }
            local_f8.fUseBridge = pAbc->fBridgeMode;
            if (pNtk != (Abc_Ntk_t *)0x0) {
              pNtk_00 = pNtk;
            }
            iVar3 = Abc_NtkDarPdr(pNtk_00,&local_f8);
            pAbc->Status = iVar3;
            pAbc->nFrames = -(uint)(pNtk_00->vSeqModelVec != (Vec_Ptr_t *)0x0) | local_f8.iFrame;
            Abc_FrameReplacePoStatuses(pAbc,&local_f8.vOutMap);
            if (pNtk_00->vSeqModelVec == (Vec_Ptr_t *)0x0) {
              Abc_FrameReplaceCex(pAbc,&pNtk_00->pSeqModel);
            }
            else {
              Abc_FrameReplaceCexVec(pAbc,&pNtk_00->vSeqModelVec);
            }
            if (pNtk != (Abc_Ntk_t *)0x0) {
              Abc_NtkDelete(pNtk);
            }
            if (local_108 == (char *)0x0) {
              return 0;
            }
            Abc_NtkWriteLogFile(local_108,pAbc->pCex,pAbc->Status,pAbc->nFrames,"pdr");
            return 0;
          }
          pcVar5 = "The miters is already solved; skipping the command.\n";
          iVar3 = 1;
          goto LAB_002746b4;
        }
        pcVar5 = "The current network is not an AIG (run \"strash\").\n";
      }
      iVar3 = -2;
LAB_002746b4:
      Abc_Print(iVar3,pcVar5);
      return 0;
    }
    goto switchD_00273ece_caseD_45;
  }
  Abc_Print(-1,pcVar5);
  goto switchD_00273ece_caseD_45;
}

Assistant:

int Abc_CommandPdr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkDarPdr( Abc_Ntk_t * pNtk, Pdr_Par_t * pPars );
    Pdr_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc), * pNtkUsed, * pNtkFlop = NULL;
    char * pLogFileName = NULL;
    int c;
    Pdr_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MFCDQTHGSLIaxrmuyfqipdegjonctkvwzh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRecycle = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRecycle < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrameMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrameMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfGenLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfGenLimit < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRestLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRestLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOutOne = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOutOne < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOutGap < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRandomSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRandomSeed < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pInvFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'a':
            pPars->fSolveAll ^= 1;
            break;
        case 'x':
            pPars->fStoreCex ^= 1;
            break;
        case 'r':
            pPars->fTwoRounds ^= 1;
            break;
        case 'm':
            pPars->fMonoCnf ^= 1;
            break;
        case 'u':
            pPars->fNewXSim ^= 1;
            break;
        case 'y':
            pPars->fFlopPrio ^= 1;
            break;
        case 'f':
            pPars->fFlopOrder ^= 1;
            break;
        case 'q':
            pPars->fShortest ^= 1;
            break;
        case 'i':
            pPars->fShiftStart ^= 1;
            break;
        case 'p':
            pPars->fReuseProofOblig ^= 1;
            break;
        case 'd':
            pPars->fDumpInv ^= 1;
            break;
        case 'e':
            pPars->fUseSupp ^= 1;
            break;
        case 'g':
            pPars->fSkipGeneral ^= 1;
            break;
        case 'j':
            pPars->fSimpleGeneral ^= 1;
            break;
        case 'o':
            pPars->fUsePropOut ^= 1;
            break;
        case 'n':
            pPars->fSkipDown ^= 1;
            break;
        case 'c':
            pPars->fCtgs ^= 1;
            break;
        case 't':
            pPars->fUseAbs ^= 1;
            break;
        case 'k':
            pPars->fUseSimpleRef ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'z':
            pPars->fNotVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -2, "There is no current network.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -2, "The current network is not an AIG (run \"strash\").\n");
        return 0;
    }
    if ( pAbc->fBatchMode && (pAbc->Status == 0 || pAbc->Status == 1) ) 
    { 
        Abc_Print( 1, "The miters is already solved; skipping the command.\n" ); 
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        pNtkFlop = Abc_NtkDup( pNtk );
        Abc_NtkAddLatch( pNtkFlop, Abc_AigConst1(pNtkFlop), ABC_INIT_ONE );
    }
    // run the procedure
    pPars->fUseBridge = pAbc->fBridgeMode;
    pNtkUsed = pNtkFlop ? pNtkFlop : pNtk;
    pAbc->Status  = Abc_NtkDarPdr( pNtkUsed, pPars );
    pAbc->nFrames = pNtkUsed->vSeqModelVec ? -1 : pPars->iFrame;
    Abc_FrameReplacePoStatuses( pAbc, &pPars->vOutMap );
    if ( pNtkUsed->vSeqModelVec )
        Abc_FrameReplaceCexVec( pAbc, &pNtkUsed->vSeqModelVec );
    else
        Abc_FrameReplaceCex( pAbc, &pNtkUsed->pSeqModel );
    if ( pNtkFlop ) Abc_NtkDelete( pNtkFlop );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "pdr" );
    return 0;

usage:
    Abc_Print( -2, "usage: pdr [-MFCDQTHGS <num>] [-LI <file>] [-axrmuyfqipdegjonctkvwzh]\n" );
    Abc_Print( -2, "\t         model checking using property directed reachability (aka IC3)\n" );
    Abc_Print( -2, "\t         pioneered by Aaron R. Bradley (http://theory.stanford.edu/~arbrad/)\n" );
    Abc_Print( -2, "\t         with improvements by Niklas Een (http://een.se/niklas/)\n" );
    Abc_Print( -2, "\t-M num : limit on unused vars to trigger SAT solver recycling [default = %d]\n",       pPars->nRecycle );
    Abc_Print( -2, "\t-F num : limit on timeframes explored to stop computation [default = %d]\n",           pPars->nFrameMax );
    Abc_Print( -2, "\t-C num : limit on conflicts in one SAT call (0 = no limit) [default = %d]\n",          pPars->nConfLimit );
    Abc_Print( -2, "\t-D num : limit on conflicts during ind-generalization (0 = no limit) [default = %d]\n",pPars->nConfGenLimit );
    Abc_Print( -2, "\t-Q num : limit on proof obligations before a restart (0 = no limit) [default = %d]\n", pPars->nRestLimit );
    Abc_Print( -2, "\t-T num : runtime limit, in seconds (0 = no limit) [default = %d]\n",                   pPars->nTimeOut );
    Abc_Print( -2, "\t-H num : runtime limit per output, in miliseconds (with \"-a\") [default = %d]\n",     pPars->nTimeOutOne );
    Abc_Print( -2, "\t-G num : runtime gap since the last CEX (0 = no limit) [default = %d]\n",              pPars->nTimeOutGap );
    Abc_Print( -2, "\t-S num : * value to seed the SAT solver with [default = %d]\n",                          pPars->nRandomSeed );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n",                                          pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-I file: the invariant file name [default = %s]\n",                                    pPars->pInvFileName ? pPars->pInvFileName : "default name" );
    Abc_Print( -2, "\t-a     : toggle solving all outputs even if one of them is SAT [default = %s]\n",      pPars->fSolveAll? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle storing CEXes when solving all outputs [default = %s]\n",              pPars->fStoreCex? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle using more effort in generalization [default = %s]\n",                 pPars->fTwoRounds? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using monolythic CNF computation [default = %s]\n",                    pPars->fMonoCnf? "yes": "no" );
    Abc_Print( -2, "\t-u     : toggle updated X-valued simulation [default = %s]\n",                         pPars->fNewXSim? "yes": "no" );
    Abc_Print( -2, "\t-y     : toggle using structural flop priorities [default = %s]\n",                    pPars->fFlopPrio? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle ordering flops by cost before generalization [default = %s]\n",        pPars->fFlopOrder? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle creating only shortest counter-examples [default = %s]\n",             pPars->fShortest? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle clause pushing from an intermediate timeframe [default = %s]\n",       pPars->fShiftStart? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle reusing proof-obligations in the last timeframe [default = %s]\n",     pPars->fReuseProofOblig? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dumping invariant (valid if init state is all-0) [default = %s]\n",    pPars->fDumpInv? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle using only support variables in the invariant [default = %s]\n",       pPars->fUseSupp? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle skipping expensive generalization step [default = %s]\n",              pPars->fSkipGeneral? "yes": "no" );
    Abc_Print( -2, "\t-j     : toggle using simplified generalization step [default = %s]\n",                pPars->fSimpleGeneral? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle using property output as inductive hypothesis [default = %s]\n",       pPars->fUsePropOut? "yes": "no" );
    Abc_Print( -2, "\t-n     : * toggle skipping \'down\' in generalization [default = %s]\n",                 pPars->fSkipDown? "yes": "no" );
    Abc_Print( -2, "\t-c     : * toggle handling CTGs in \'down\' [default = %s]\n",                           pPars->fCtgs? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle using abstraction [default = %s]\n",                                   pPars->fUseAbs? "yes": "no" );
    Abc_Print( -2, "\t-k     : toggle using simplified refinement [default = %s]\n",                         pPars->fUseSimpleRef? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing optimization summary [default = %s]\n",                       pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing detailed stats default = %s]\n",                              pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle suppressing report about solved outputs [default = %s]\n",             pPars->fNotVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n\n");
    Abc_Print( -2, "\t* Implementation of switches -S, -n, and -c is contributed by Zyad Hassan.\n");
    Abc_Print( -2, "\t  The theory and experiments supporting this work can be found in the following paper:\n");
    Abc_Print( -2, "\t  Zyad Hassan, Aaron R. Bradley, Fabio Somenzi, \"Better Generalization in IC3\", FMCAD 2013.\n");
    Abc_Print( -2, "\t  (http://www.cs.utexas.edu/users/hunt/FMCAD/FMCAD13/papers/85-Better-Generalization-IC3.pdf)\n");



    return 1;
}